

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

cl_int __thiscall
CLIntercept::ReadImage
          (CLIntercept *this,cl_command_queue commandQueue,cl_mem srcImage,cl_bool blockingRead,
          size_t *srcOrigin,size_t *region,size_t dstRowPitch,size_t dstSlicePitch,void *dstPtr,
          cl_uint numEventsInWaitList,cl_event *eventWaitList,cl_event *event)

{
  mutex *__mutex;
  size_t sVar1;
  size_t sVar2;
  cl_int cVar3;
  int iVar4;
  void *pvVar5;
  cl_mem dstImage;
  undefined8 uVar6;
  cl_int local_74;
  cl_command_queue local_70;
  cl_image_format srcFormat;
  cl_context context;
  cl_bool local_54;
  cl_mem local_50;
  size_t dstOrigin [3];
  
  sVar2 = dstSlicePitch;
  sVar1 = dstRowPitch;
  __mutex = &this->m_Mutex;
  local_70 = commandQueue;
  local_54 = blockingRead;
  local_50 = srcImage;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    uVar6 = std::__throw_system_error(iVar4);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar6);
  }
  context = (cl_context)0x0;
  local_74 = -0x1e;
  if (srcOrigin == (size_t *)0x0 || region == (size_t *)0x0) {
    srcFormat.image_channel_order = 0;
    srcFormat.image_channel_data_type = 0;
    dstImage = (cl_mem)0x0;
  }
  else {
    local_74 = 0;
    local_74 = (*(this->m_Dispatch).clGetCommandQueueInfo)(local_70,0x1090,8,&context,(size_t *)0x0)
    ;
    srcFormat.image_channel_order = 0;
    srcFormat.image_channel_data_type = 0;
    if ((local_74 != 0) ||
       (local_74 = (*(this->m_Dispatch).clGetImageInfo)(local_50,0x1110,8,&srcFormat,(size_t *)0x0),
       local_74 != 0)) {
      dstOrigin[0] = 0;
      dstOrigin[1] = 0;
      dstOrigin[2] = 0;
      dstImage = (cl_mem)0x0;
      goto LAB_001889f2;
    }
    if (region[2] == 1) {
      dstImage = (*(this->m_Dispatch).clCreateImage2D)
                           (context,10,&srcFormat,*region,region[1],sVar1,dstPtr,&local_74);
    }
    else {
      dstImage = (*(this->m_Dispatch).clCreateImage3D)
                           (context,10,&srcFormat,*region,region[1],region[2],sVar1,sVar2,dstPtr,
                            &local_74);
    }
  }
  dstOrigin[0] = 0;
  dstOrigin[1] = 0;
  dstOrigin[2] = 0;
  if (((local_74 == 0) &&
      (local_74 = CopyImageHelper(this,context,local_70,local_50,dstImage,srcOrigin,dstOrigin,region
                                  ,numEventsInWaitList,eventWaitList,event), local_74 == 0)) &&
     (pvVar5 = (*(this->m_Dispatch).clEnqueueMapImage)
                         (local_70,dstImage,local_54,1,dstOrigin,region,&dstRowPitch,&dstSlicePitch,
                          0,(cl_event *)0x0,(cl_event *)0x0,&local_74), local_74 == 0)) {
    local_74 = (*(this->m_Dispatch).clEnqueueUnmapMemObject)
                         (local_70,dstImage,pvVar5,0,(cl_event *)0x0,(cl_event *)0x0);
  }
LAB_001889f2:
  (*(this->m_Dispatch).clReleaseMemObject)(dstImage);
  cVar3 = local_74;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return cVar3;
}

Assistant:

cl_int CLIntercept::ReadImage(
    cl_command_queue commandQueue,
    cl_mem srcImage,
    cl_bool blockingRead,
    const size_t* srcOrigin,
    const size_t* region,
    size_t dstRowPitch,
    size_t dstSlicePitch,
    void* dstPtr,
    cl_uint numEventsInWaitList,
    const cl_event* eventWaitList,
    cl_event* event )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    // Basic error checking, to avoid possible null pointer dereferences.
    if( errorCode == CL_SUCCESS )
    {
        if( srcOrigin == NULL || region == NULL )
        {
            errorCode = CL_INVALID_VALUE;
        }
    }

    cl_context  context = NULL;

    // Get the context for this command queue.
    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetCommandQueueInfo(
            commandQueue,
            CL_QUEUE_CONTEXT,
            sizeof( context ),
            &context,
            NULL );
    }

    // Create a USE_HOST_PTR image for the passed-in pointer.
    // The size of the buffer will be at least as big as the region to read.

    // We need to know what type of image to create.
    // If region[2] is 1, then a 2D image will suffice,
    // otherwise we'll need to create a 3D image.

    // The image will have the same image format as srcImage.

    cl_image_format srcFormat = { 0 };

    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetImageInfo(
            srcImage,
            CL_IMAGE_FORMAT,
            sizeof( srcFormat ),
            &srcFormat,
            NULL );
    }

    cl_mem  dstImage = NULL;

    if( errorCode == CL_SUCCESS )
    {
        if( region[2] == 1 )
        {
            // 2D image
            dstImage = dispatch().clCreateImage2D(
                context,
                CL_MEM_USE_HOST_PTR | CL_MEM_WRITE_ONLY,
                &srcFormat,
                region[0],
                region[1],
                dstRowPitch,
                dstPtr,
                &errorCode );
        }
        else
        {
            // 3D image
            dstImage = dispatch().clCreateImage3D(
                context,
                CL_MEM_USE_HOST_PTR | CL_MEM_WRITE_ONLY,
                &srcFormat,
                region[0],
                region[1],
                region[2],
                dstRowPitch,
                dstSlicePitch,
                dstPtr,
                &errorCode );
        }
    }

    size_t  dstOrigin[3] = { 0, 0, 0 };

    if( errorCode == CL_SUCCESS )
    {
        errorCode = CopyImageHelper(
            context,
            commandQueue,
            srcImage,
            dstImage,
            srcOrigin,
            dstOrigin,
            region,
            numEventsInWaitList,
            eventWaitList,
            event );
    }

    // Technically, we need to map and unmap the destination image
    // to transfer data to our pointer.  This will also handle
    // blockingRead.
    if( errorCode == CL_SUCCESS )
    {
        void* mappedPointer = dispatch().clEnqueueMapImage(
            commandQueue,
            dstImage,
            blockingRead,
            CL_MAP_READ,
            dstOrigin,
            region,
            &dstRowPitch,
            &dstSlicePitch,
            0,
            NULL,
            NULL,
            &errorCode );

        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clEnqueueUnmapMemObject(
                commandQueue,
                dstImage,
                mappedPointer,
                0,
                NULL,
                NULL );
        }
    }

    dispatch().clReleaseMemObject( dstImage );

    return errorCode;
}